

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_buildmap.cpp
# Opt level: O0

bool P_LoadBuildMap(BYTE *data,size_t len,FMapThing **sprites,int *numspr)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint numwalls_00;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  FMapThing *pFVar7;
  FMapThing *local_70;
  int numsprites;
  int numwalls;
  int numsec;
  int *numspr_local;
  FMapThing **sprites_local;
  size_t len_local;
  BYTE *data_local;
  
  if (len < 0x1a) {
    data_local._7_1_ = false;
  }
  else if (*(int *)data == 0x1a4d4c42) {
    data_local._7_1_ = P_LoadBloodMap(data,len,sprites,numspr);
  }
  else {
    uVar3 = (uint)*(ushort *)(data + 0x14);
    if ((((len < (long)(int)uVar3 * 0x28 + 0x1aU) ||
         (numwalls_00 = (uint)*(ushort *)(data + (long)(int)uVar3 * 0x28 + 0x16),
         len < (ulong)((long)(int)uVar3 * 0x28 + 0x18 + (long)(int)numwalls_00 * 0x20))) ||
        (*(int *)data != 7)) || (0x7ff < *(ushort *)(data + 0x10))) {
      data_local._7_1_ = false;
    }
    else {
      numsectors = uVar3;
      LoadSectors((sectortype *)(data + 0x16));
      LoadWalls((walltype *)(data + (long)numsectors * 0x28 + 0x18),numwalls_00,
                (sectortype *)(data + 0x16));
      uVar1 = *(ushort *)(data + (long)(int)numwalls_00 * 0x20 + (long)numsectors * 0x28 + 0x18);
      uVar5 = (ulong)(int)(uVar1 + 1);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar5;
      uVar6 = SUB168(auVar2 * ZEXT816(0x90),0);
      if (SUB168(auVar2 * ZEXT816(0x90),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      pFVar7 = (FMapThing *)operator_new__(uVar6);
      if (uVar5 != 0) {
        local_70 = pFVar7;
        do {
          FMapThing::FMapThing(local_70);
          local_70 = local_70 + 1;
        } while (local_70 != pFVar7 + uVar5);
      }
      *sprites = pFVar7;
      CreateStartSpot((SDWORD *)(data + 4),*sprites);
      iVar4 = LoadSprites((spritetype *)
                          (data + (long)(int)numwalls_00 * 0x20 + (long)numsectors * 0x28 + 0x1a),
                          (Xsprite *)0x0,(uint)uVar1,(sectortype *)(data + 0x16),*sprites + 1);
      *numspr = iVar4 + 1;
      data_local._7_1_ = true;
    }
  }
  return data_local._7_1_;
}

Assistant:

bool P_LoadBuildMap (BYTE *data, size_t len, FMapThing **sprites, int *numspr)
{
	if (len < 26)
	{
		return false;
	}

	// Check for a Blood map.
	if (*(DWORD *)data == MAKE_ID('B','L','M','\x1a'))
	{
		return P_LoadBloodMap (data, len, sprites, numspr);
	}

	const int numsec = LittleShort(*(WORD *)(data + 20));
	int numwalls;
	int numsprites;

	if (len < 26 + numsec*sizeof(sectortype) ||
		(numwalls = LittleShort(*(WORD *)(data + 22 + numsec*sizeof(sectortype))),
			len < 24 + numsec*sizeof(sectortype) + numwalls*sizeof(walltype)) ||
		LittleLong(*(DWORD *)data) != 7 ||
		LittleShort(*(WORD *)(data + 16)) >= 2048)
	{ // Can't possibly be a version 7 BUILD map
		return false;
	}

	numsectors = numsec;
	LoadSectors ((sectortype *)(data + 22));
	LoadWalls ((walltype *)(data + 24 + numsectors*sizeof(sectortype)), numwalls,
		(sectortype *)(data + 22));

	numsprites = *(WORD *)(data + 24 + numsectors*sizeof(sectortype) + numwalls*sizeof(walltype));
	*sprites = new FMapThing[numsprites + 1];
	CreateStartSpot ((SDWORD *)(data + 4), *sprites);
	*numspr = 1 + LoadSprites ((spritetype *)(data + 26 + numsectors*sizeof(sectortype) + numwalls*sizeof(walltype)),
		NULL, numsprites, (sectortype *)(data + 22), *sprites + 1);

	return true;
}